

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_common_content_access<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,false>>>,unsigned_int>
               (Unordered_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
                *col,set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *setcont,vector<bool,_std::allocator<bool>_> *veccont)

{
  Column_support *this;
  ulong *puVar1;
  uint uVar2;
  _Hash_node_base *p_Var3;
  _Rb_tree_const_iterator<unsigned_int> __first1;
  bool bVar4;
  _Bit_type *p_Var5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  uint uVar9;
  __hash_code __code;
  ulong __code_00;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __first2;
  vector<bool,_std::allocator<bool>_> container;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_238;
  _Rb_tree_node_base local_200;
  undefined **local_1e0;
  ulong local_1d8;
  shared_count sStack_1d0;
  size_t **local_1c8;
  Unordered_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
  *local_1c0;
  char *local_1b8;
  char *local_1b0;
  shared_count sStack_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  size_t local_140;
  size_t local_138;
  size_t *local_130;
  size_t *local_128;
  char *local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x11d);
  get_column_content_via_iterators<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<true,(Gudhi::persistence_matrix::Column_types)6,true,true,false>>>>
            ((column_content<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>
              *)&local_238,col);
  if (local_238._M_impl.super__Rb_tree_header._M_node_count ==
      (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    __first1._M_node._4_4_ = local_238._M_impl.super__Rb_tree_header._M_header._M_left._4_4_;
    __first1._M_node._0_4_ = (uint)local_238._M_impl.super__Rb_tree_header._M_header._M_left;
    bVar4 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<unsigned_int>,std::_Rb_tree_const_iterator<unsigned_int>>
                      (__first1,(_Rb_tree_const_iterator<unsigned_int>)
                                &local_238._M_impl.super__Rb_tree_header,
                       (setcont->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar4 = false;
  }
  local_200._M_color._0_1_ = bVar4;
  local_200._M_parent = (_Base_ptr)0x0;
  local_200._M_left = (_Base_ptr)0x0;
  local_1b8 = "get_column_content_via_iterators(col) == setcont";
  local_1b0 = "";
  local_1d8 = local_1d8 & 0xffffffffffffff00;
  local_1e0 = &PTR__lazy_ostream_001de388;
  sStack_1d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_1c8 = (size_t **)&local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_200._M_left);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_238);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x11e);
  uVar9 = (*(int *)&(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          *(int *)&(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 +
          (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
          _M_finish.super__Bit_iterator_base._M_offset;
  if ((int)uVar9 < 0) {
    if ((col->column_)._M_h._M_element_count == 0) {
      local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_238._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
      local_238._M_impl.super__Rb_tree_header._M_header._M_left._4_4_ = 0;
      local_238._M_impl._0_4_ = 0;
      local_238._M_impl._4_4_ = 0;
      local_238._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
      local_238._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      goto LAB_00127e07;
    }
    p_Var8 = (col->column_)._M_h._M_before_begin._M_nxt;
    if (p_Var8 != (_Hash_node_base *)0x0) {
      p_Var3 = p_Var8->_M_nxt;
      for (; p_Var3 != (_Hash_node_base *)0x0; p_Var3 = p_Var3->_M_nxt) {
        p_Var7 = p_Var3;
        if (*(uint *)((long)&(p_Var3[1]._M_nxt)->_M_nxt + 4) <=
            *(uint *)((long)&(p_Var8[1]._M_nxt)->_M_nxt + 4)) {
          p_Var7 = p_Var8;
        }
        p_Var8 = p_Var7;
      }
    }
    uVar9 = *(int *)((long)&(p_Var8[1]._M_nxt)->_M_nxt + 4) + 1;
  }
  local_1e0 = (undefined **)((ulong)local_1e0 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_238,(long)(int)uVar9,(bool *)&local_1e0,
             (allocator_type *)&local_1b8);
  for (p_Var8 = (col->column_)._M_h._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
      p_Var8 = p_Var8->_M_nxt) {
    uVar2 = *(uint *)((long)&(p_Var8[1]._M_nxt)->_M_nxt + 4);
    if (uVar2 < uVar9) {
      puVar1 = (ulong *)(local_238._M_impl._0_8_ + (ulong)(uVar2 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)uVar2 & 0x3f);
    }
  }
LAB_00127e07:
  __last1.super__Bit_iterator_base._M_offset =
       (uint)local_238._M_impl.super__Rb_tree_header._M_header._M_left;
  __last1.super__Bit_iterator_base._M_p =
       (_Bit_type *)local_238._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var5 = (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if ((ulong)(uint)local_238._M_impl.super__Rb_tree_header._M_header._M_left +
      ((long)local_238._M_impl.super__Rb_tree_header._M_header._M_parent - local_238._M_impl._0_8_)
      * 8 == (ulong)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
             ((long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var5)
             * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_238._M_impl._0_8_;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p = p_Var5;
    bVar4 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_00,__last1,__first2);
  }
  else {
    bVar4 = false;
  }
  local_200._M_color._0_1_ = bVar4;
  local_200._M_parent = (_Base_ptr)0x0;
  local_200._M_left = (_Base_ptr)0x0;
  local_1b8 = "col.get_content(veccont.size()) == veccont";
  local_1b0 = "";
  local_1d8 = local_1d8 & 0xffffffffffffff00;
  local_1e0 = &PTR__lazy_ostream_001de388;
  sStack_1d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_1c8 = (size_t **)&local_1b8;
  boost::test_tools::tt_detail::report_assertion(&local_200,&local_1e0,&local_a0,0x11e,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&local_200._M_left);
  if ((Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
       )local_238._M_impl._0_8_ !=
      (Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>
       )0x0) {
    operator_delete((void *)local_238._M_impl._0_8_,
                    (long)local_238._M_impl.super__Rb_tree_header._M_header._M_right -
                    local_238._M_impl._0_8_);
    local_238._M_impl._0_4_ = 0;
    local_238._M_impl._4_4_ = 0;
    local_238._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_238._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    local_238._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_238._M_impl.super__Rb_tree_header._M_header._M_left._0_4_ = 0;
    local_238._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  }
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x120);
  local_200._M_parent = (_Base_ptr)((ulong)local_200._M_parent & 0xffffffffffffff00);
  local_200._0_8_ = &PTR__lazy_ostream_001de440;
  local_200._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_200._M_right = (_Base_ptr)0x1a9184;
  local_138 = (col->column_)._M_h._M_element_count;
  local_128 = &local_138;
  local_140 = (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_1b8 = (char *)CONCAT71(local_1b8._1_7_,local_138 == local_140);
  local_130 = &local_140;
  local_1b0 = (char *)0x0;
  sStack_1a8.pi_ = (sp_counted_base *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_238._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_128;
  local_238._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_238._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
  local_238._M_impl._0_8_ = &PTR__lazy_ostream_001de400;
  local_238._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1c8 = &local_130;
  local_1d8 = local_1d8 & 0xffffffffffffff00;
  local_1e0 = &PTR__lazy_ostream_001de400;
  sStack_1d0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1a8);
  local_1c0 = col;
  if (((veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._M_p ==
       (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p) &&
     ((veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset == 0)) {
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x124);
    local_1e0 = (undefined **)CONCAT71(local_1e0._1_7_,(col->column_)._M_h._M_element_count == 0);
    local_1d8 = 0;
    sStack_1d0.pi_ = (sp_counted_base *)0x0;
    local_200._0_8_ = "col.is_empty()";
    local_200._M_parent = (_Base_ptr)0x1a9d4d;
    local_238._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_238._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
    local_238._M_impl._0_8_ = &PTR__lazy_ostream_001de388;
    local_238._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_238._M_impl.super__Rb_tree_header._M_header._M_left = &local_200;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_f8 = "";
    local_110 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x126);
    local_1e0 = (undefined **)CONCAT71(local_1e0._1_7_,(col->column_)._M_h._M_element_count != 0);
    local_1d8 = 0;
    sStack_1d0.pi_ = (sp_counted_base *)0x0;
    local_200._0_8_ = "!col.is_empty()";
    local_200._M_parent = (_Base_ptr)0x1a9d4d;
    local_238._M_impl.super__Rb_tree_header._M_header._0_8_ =
         local_238._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
    local_238._M_impl._0_8_ = &PTR__lazy_ostream_001de388;
    local_238._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_238._M_impl.super__Rb_tree_header._M_header._M_left = &local_200;
    local_120 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_118 = (_Base_ptr)0x1a9cc7;
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_1d0);
  p_Var5 = (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  if (((long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p - (long)p_Var5) * 8 +
      (ulong)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_offset != 0) {
    this = &local_1c0->column_;
    uVar9 = 1;
    __code_00 = 0;
    do {
      if ((p_Var5[__code_00 >> 6] >> (__code_00 & 0x3f) & 1) == 0) {
        local_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_148 = "";
        local_160 = &boost::unit_test::basic_cstring<char_const>::null;
        local_158 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x12a,
                   &local_160);
        local_238._M_impl._4_4_ = uVar9 - 1;
        local_238._M_impl._0_4_ = 0xffffffff;
        local_200._0_8_ = &local_238;
        p_Var6 = std::
                 _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::_M_find_before_node
                           (&this->_M_h,__code_00 % (local_1c0->column_)._M_h._M_bucket_count,
                            (key_type *)&local_200,__code_00);
        if (p_Var6 == (__node_base_ptr)0x0) {
          bVar4 = true;
        }
        else {
          bVar4 = p_Var6->_M_nxt == (_Hash_node_base *)0x0;
        }
        local_1e0 = (undefined **)CONCAT71(local_1e0._1_7_,bVar4);
        local_1d8 = 0;
        sStack_1d0.pi_ = (sp_counted_base *)0x0;
        local_200._0_8_ = "!col.is_non_zero(i)";
        local_200._M_parent = (_Base_ptr)0x1a9d61;
        local_238._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_238._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
        local_238._M_impl._0_8_ = &PTR__lazy_ostream_001de388;
        local_238._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_238._M_impl.super__Rb_tree_header._M_header._M_left = &local_200;
        local_170 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_168 = "";
        boost::test_tools::tt_detail::report_assertion(&local_1e0,&local_238,&local_170,0x12a,1,0,0)
        ;
      }
      else {
        local_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_178 = "";
        local_190 = &boost::unit_test::basic_cstring<char_const>::null;
        local_188 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,300,&local_190)
        ;
        local_238._M_impl._4_4_ = uVar9 - 1;
        local_238._M_impl._0_4_ = 0xffffffff;
        local_200._0_8_ = &local_238;
        bVar4 = false;
        p_Var6 = std::
                 _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::_M_find_before_node
                           (&this->_M_h,__code_00 % (local_1c0->column_)._M_h._M_bucket_count,
                            (key_type *)&local_200,__code_00);
        if (p_Var6 != (__node_base_ptr)0x0) {
          bVar4 = p_Var6->_M_nxt != (_Hash_node_base *)0x0;
        }
        local_1e0 = (undefined **)CONCAT71(local_1e0._1_7_,bVar4);
        local_1d8 = 0;
        sStack_1d0.pi_ = (sp_counted_base *)0x0;
        local_200._0_8_ = "col.is_non_zero(i)";
        local_200._M_parent = (_Base_ptr)0x1a9d61;
        local_238._M_impl.super__Rb_tree_header._M_header._0_8_ =
             local_238._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffffffffff00;
        local_238._M_impl._0_8_ = &PTR__lazy_ostream_001de388;
        local_238._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_238._M_impl.super__Rb_tree_header._M_header._M_left = &local_200;
        local_1a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_198 = "";
        boost::test_tools::tt_detail::report_assertion(&local_1e0,&local_238,&local_1a0,300,1,0,0);
      }
      boost::detail::shared_count::~shared_count(&sStack_1d0);
      __code_00 = (ulong)uVar9;
      p_Var5 = (veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
      uVar9 = uVar9 + 1;
    } while (__code_00 <
             (ulong)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
             ((long)(veccont->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var5)
             * 8);
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}